

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
removeGarbageUntilUnder
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this,int limit,Random *rnd)

{
  InternalError *this_00;
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  iVar1 = computeApproxMemUsage(this);
  while( true ) {
    if (iVar1 <= limit) {
      return;
    }
    iVar2 = removeRandomGarbage(this,rnd);
    if (iVar2 < 0) break;
    iVar1 = iVar1 - iVar2;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,0x1aee929);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_f0 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_f0 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_d0 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_d0 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::InternalError::InternalError(this_00,&local_b0);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLObjectManager<T>::removeGarbageUntilUnder (const int limit, Random& rnd)
{
	int memUsage = computeApproxMemUsage();

	while (memUsage > limit)
	{
		const int memReleased = removeRandomGarbage(rnd);
		if (memReleased < 0)
			throw tcu::InternalError(string("") + "Given " + objTypeName() + " memory usage limit exceeded, and no unneeded " + objTypeName() + " resources available to release");
		memUsage -= memReleased;
		DE_ASSERT(memUsage == computeApproxMemUsage());
	}
}